

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_read(uv_loop_t *loop,uv_fs_t *req,uv_file file,void *buf,size_t len,int64_t off,
              uv_fs_cb cb)

{
  uv__work *in_RCX;
  undefined4 in_EDX;
  uv_req_t *in_RSI;
  uv_loop_t *in_RDI;
  uv__work *in_R8;
  _func_void_uv__work_ptr_int *in_R9;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  uv__req_init(in_RDI,in_RSI,UV_FS);
  *(undefined4 *)&in_RSI[1].data = 3;
  in_RSI[1].active_queue[1] = (void *)0x0;
  in_RSI[2].data = (void *)0x0;
  *(uv_loop_t **)&in_RSI[1].type = in_RDI;
  *(undefined8 *)&in_RSI[2].type = 0;
  in_RSI[7].active_queue[0] = (void *)0x0;
  in_RSI[1].active_queue[0] = (void *)len;
  *(undefined4 *)(in_RSI[7].active_queue + 1) = in_EDX;
  *(uv__work **)&in_RSI[8].type = in_RCX;
  in_RSI[8].active_queue[0] = in_R8;
  in_RSI[8].active_queue[1] = in_R9;
  if (len == 0) {
    uv__fs_work((uv__work *)in_RDI);
    uv__fs_done(in_R8,(int)((ulong)in_R9 >> 0x20));
    local_4 = (int)in_RSI[1].active_queue[1];
  }
  else {
    uv__work_submit((uv_loop_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
                    (_func_void_uv__work_ptr *)in_R8,in_R9);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv_fs_read(uv_loop_t* loop, uv_fs_t* req,
               uv_file file,
               void* buf,
               size_t len,
               int64_t off,
               uv_fs_cb cb) {
  INIT(READ);
  req->file = file;
  req->buf = buf;
  req->len = len;
  req->off = off;
  POST;
}